

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void count_categs(size_t *ix_arr,size_t st,size_t end,int *x,int ncat,size_t *counts)

{
  long in_RCX;
  long lVar1;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  long in_R9;
  size_t row;
  unsigned_long *in_stack_ffffffffffffffb8;
  unsigned_long *in_stack_ffffffffffffffc0;
  
  std::fill<unsigned_long*,unsigned_long>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(unsigned_long *)0x1ad56b);
  for (; in_RSI <= in_RDX; in_RSI = in_RSI + 1) {
    if (-1 < *(int *)(in_RCX + *(long *)(in_RDI + in_RSI * 8) * 4)) {
      lVar1 = (long)*(int *)(in_RCX + *(long *)(in_RDI + in_RSI * 8) * 4);
      *(long *)(in_R9 + lVar1 * 8) = *(long *)(in_R9 + lVar1 * 8) + 1;
    }
  }
  return;
}

Assistant:

void count_categs(size_t *restrict ix_arr, size_t st, size_t end, int x[], int ncat, size_t *restrict counts)
{
    std::fill(counts, counts + ncat, (size_t)0);
    for (size_t row = st; row <= end; row++)
        if (likely(x[ix_arr[row]] >= 0))
            counts[x[ix_arr[row]]]++;
}